

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O0

void * xmlNanoFTPOpen(char *URL)

{
  int iVar1;
  int sock;
  xmlNanoFTPCtxtPtr ctxt;
  char *URL_local;
  
  xmlNanoFTPInit();
  if (URL == (char *)0x0) {
    URL_local = (char *)0x0;
  }
  else {
    iVar1 = strncmp("ftp://",URL,6);
    if (iVar1 == 0) {
      URL_local = (char *)xmlNanoFTPNewCtxt(URL);
      if (URL_local == (char *)0x0) {
        URL_local = (char *)0x0;
      }
      else {
        iVar1 = xmlNanoFTPConnect(URL_local);
        if (iVar1 < 0) {
          xmlNanoFTPFreeCtxt(URL_local);
          URL_local = (char *)0x0;
        }
        else {
          iVar1 = xmlNanoFTPGetSocket(URL_local,*(char **)(URL_local + 0x18));
          if (iVar1 == -1) {
            xmlNanoFTPFreeCtxt(URL_local);
            URL_local = (char *)0x0;
          }
        }
      }
    }
    else {
      URL_local = (char *)0x0;
    }
  }
  return URL_local;
}

Assistant:

void*
xmlNanoFTPOpen(const char *URL) {
    xmlNanoFTPCtxtPtr ctxt;
    SOCKET sock;

    xmlNanoFTPInit();
    if (URL == NULL) return(NULL);
    if (strncmp("ftp://", URL, 6)) return(NULL);

    ctxt = (xmlNanoFTPCtxtPtr) xmlNanoFTPNewCtxt(URL);
    if (ctxt == NULL) return(NULL);
    if (xmlNanoFTPConnect(ctxt) < 0) {
	xmlNanoFTPFreeCtxt(ctxt);
	return(NULL);
    }
    sock = xmlNanoFTPGetSocket(ctxt, ctxt->path);
    if (sock == INVALID_SOCKET) {
	xmlNanoFTPFreeCtxt(ctxt);
	return(NULL);
    }
    return(ctxt);
}